

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisitorTests.cpp
# Opt level: O3

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::InterleavedRewriter>::
visit<slang::syntax::FunctionDeclarationSyntax&>
          (SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::InterleavedRewriter> *this,
          FunctionDeclarationSyntax *t)

{
  pointer *ppSVar1;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
  *ptVar2;
  char *pcVar3;
  iterator iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  FunctionPortSyntax *pFVar8;
  Info *pIVar9;
  SyntaxNode **ppSVar10;
  FunctionPortListSyntax *portList;
  pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
  *ppVar11;
  vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
  *this_00;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong hash;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  Token TVar23;
  Token TVar24;
  string_view name;
  string_view name_00;
  locator res;
  try_emplace_args_t local_a9;
  pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
  *local_a8;
  FunctionPortSyntax *local_a0;
  SyntaxNode *local_98;
  undefined1 local_90 [16];
  Token local_80;
  ulong local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  if (t != (FunctionDeclarationSyntax *)0x0) {
    name._M_str = "argA";
    name._M_len = 4;
    local_a0 = RewriterBase<InterleavedRewriter>::makeArg
                         ((RewriterBase<InterleavedRewriter> *)this,name);
    TVar23 = SyntaxRewriter<InterleavedRewriter>::makeComma
                       ((SyntaxRewriter<InterleavedRewriter> *)this);
    pIVar9 = TVar23.info;
    local_a8 = TVar23._0_8_;
    ptVar2 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
              *)(this + 0xb0);
    ppSVar10 = &(t->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode
    ;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = ppSVar10;
    hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar7 = hash >> ((byte)this[0xb0] & 0x3f);
    local_68 = (&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                 word)[hash & 0xff];
    uVar16 = (uint)hash & 7;
    local_70 = *(ulong *)(this + 0xb8);
    uVar13 = 0;
    uVar15 = uVar7;
    do {
      pcVar3 = (char *)(*(long *)(this + 0xc0) + uVar15 * 0x10);
      local_48 = *pcVar3;
      cStack_47 = pcVar3[1];
      cStack_46 = pcVar3[2];
      bStack_45 = pcVar3[3];
      cStack_44 = pcVar3[4];
      cStack_43 = pcVar3[5];
      cStack_42 = pcVar3[6];
      bStack_41 = pcVar3[7];
      cStack_40 = pcVar3[8];
      cStack_3f = pcVar3[9];
      cStack_3e = pcVar3[10];
      bStack_3d = pcVar3[0xb];
      cStack_3c = pcVar3[0xc];
      cStack_3b = pcVar3[0xd];
      cStack_3a = pcVar3[0xe];
      bStack_39 = pcVar3[0xf];
      cVar19 = (char)local_68;
      auVar17[0] = -(local_48 == cVar19);
      cVar20 = (char)((uint)local_68 >> 8);
      auVar17[1] = -(cStack_47 == cVar20);
      cVar21 = (char)((uint)local_68 >> 0x10);
      auVar17[2] = -(cStack_46 == cVar21);
      bVar22 = (byte)((uint)local_68 >> 0x18);
      auVar17[3] = -(bStack_45 == bVar22);
      auVar17[4] = -(cStack_44 == cVar19);
      auVar17[5] = -(cStack_43 == cVar20);
      auVar17[6] = -(cStack_42 == cVar21);
      auVar17[7] = -(bStack_41 == bVar22);
      auVar17[8] = -(cStack_40 == cVar19);
      auVar17[9] = -(cStack_3f == cVar20);
      auVar17[10] = -(cStack_3e == cVar21);
      auVar17[0xb] = -(bStack_3d == bVar22);
      auVar17[0xc] = -(cStack_3c == cVar19);
      auVar17[0xd] = -(cStack_3b == cVar20);
      auVar17[0xe] = -(cStack_3a == cVar21);
      auVar17[0xf] = -(bStack_39 == bVar22);
      uVar12 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
      local_98 = (SyntaxNode *)ppSVar10;
      uStack_64 = local_68;
      uStack_60 = local_68;
      uStack_5c = local_68;
      if (uVar12 != 0) {
        lVar14 = *(long *)(this + 200) + uVar15 * 0x1e0;
        do {
          iVar5 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
            }
          }
          if (ppSVar10 == (SyntaxNode **)*(undefined1 **)(lVar14 + (ulong)(uint)(iVar5 << 5))) {
            ppVar11 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                       *)(lVar14 + (ulong)(uint)(iVar5 << 5));
            goto LAB_0047d49c;
          }
          uVar12 = uVar12 - 1 & uVar12;
        } while (uVar12 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar16] & bStack_39) == 0) break;
      lVar14 = uVar15 + uVar13;
      uVar13 = uVar13 + 1;
      uVar15 = lVar14 + 1U & local_70;
    } while (uVar13 <= local_70);
    if (*(ulong *)(this + 0xd8) < *(ulong *)(this + 0xd0)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_90,ptVar2,(arrays_type *)ptVar2,uVar7,hash,&local_a9,&local_98);
      *(long *)(this + 0xd8) = *(long *)(this + 0xd8) + 1;
      ppVar11 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                 *)local_80._0_8_;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_90,ptVar2,hash,&local_a9,&local_98);
      ppVar11 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                 *)local_80._0_8_;
    }
LAB_0047d49c:
    local_90._8_8_ = local_a0;
    local_80._0_8_ = local_a8;
    iVar4._M_current =
         (ppVar11->second).
         super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_90._0_8_ = ppSVar10;
    local_80.info = pIVar9;
    if (iVar4._M_current ==
        (ppVar11->second).
        super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
      ::_M_realloc_insert<slang::syntax::detail::SyntaxChange>
                (&ppVar11->second,iVar4,(SyntaxChange *)local_90);
    }
    else {
      *(pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
        **)&(iVar4._M_current)->separator = local_a8;
      ((iVar4._M_current)->separator).info = pIVar9;
      (iVar4._M_current)->first = (SyntaxNode *)ppSVar10;
      (iVar4._M_current)->second = (SyntaxNode *)local_a0;
      ppSVar1 = &(ppVar11->second).
                 super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    name_00._M_str = "argZ";
    name_00._M_len = 4;
    pFVar8 = RewriterBase<InterleavedRewriter>::makeArg
                       ((RewriterBase<InterleavedRewriter> *)this,name_00);
    TVar24 = SyntaxRewriter<InterleavedRewriter>::makeComma
                       ((SyntaxRewriter<InterleavedRewriter> *)this);
    local_a8 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                *)TVar24.info;
    local_a0 = TVar24._0_8_;
    ptVar2 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
              *)(this + 0xe0);
    uVar7 = hash >> ((byte)this[0xe0] & 0x3f);
    local_70 = *(ulong *)(this + 0xe8);
    uVar13 = 0;
    uVar15 = uVar7;
    do {
      pcVar3 = (char *)(*(long *)(this + 0xf0) + uVar15 * 0x10);
      local_58 = *pcVar3;
      cStack_57 = pcVar3[1];
      cStack_56 = pcVar3[2];
      cStack_55 = pcVar3[3];
      cStack_54 = pcVar3[4];
      cStack_53 = pcVar3[5];
      cStack_52 = pcVar3[6];
      cStack_51 = pcVar3[7];
      cStack_50 = pcVar3[8];
      cStack_4f = pcVar3[9];
      cStack_4e = pcVar3[10];
      cStack_4d = pcVar3[0xb];
      cStack_4c = pcVar3[0xc];
      cStack_4b = pcVar3[0xd];
      cStack_4a = pcVar3[0xe];
      bStack_49 = pcVar3[0xf];
      auVar18[0] = -(local_58 == (char)local_68);
      auVar18[1] = -(cStack_57 == local_68._1_1_);
      auVar18[2] = -(cStack_56 == local_68._2_1_);
      auVar18[3] = -(cStack_55 == local_68._3_1_);
      auVar18[4] = -(cStack_54 == (char)uStack_64);
      auVar18[5] = -(cStack_53 == uStack_64._1_1_);
      auVar18[6] = -(cStack_52 == uStack_64._2_1_);
      auVar18[7] = -(cStack_51 == uStack_64._3_1_);
      auVar18[8] = -(cStack_50 == (char)uStack_60);
      auVar18[9] = -(cStack_4f == uStack_60._1_1_);
      auVar18[10] = -(cStack_4e == uStack_60._2_1_);
      auVar18[0xb] = -(cStack_4d == uStack_60._3_1_);
      auVar18[0xc] = -(cStack_4c == (char)uStack_5c);
      auVar18[0xd] = -(cStack_4b == uStack_5c._1_1_);
      auVar18[0xe] = -(cStack_4a == uStack_5c._2_1_);
      auVar18[0xf] = -(bStack_49 == uStack_5c._3_1_);
      uVar12 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
      if (uVar12 != 0) {
        lVar14 = *(long *)(this + 0xf8) + uVar15 * 0x1e0;
        do {
          iVar5 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
            }
          }
          if (ppSVar10 == (SyntaxNode **)*(undefined1 **)(lVar14 + (ulong)(uint)(iVar5 << 5))) {
            local_80._0_8_ = lVar14 + (ulong)(uint)(iVar5 << 5);
            local_98 = (SyntaxNode *)ppSVar10;
            goto LAB_0047d619;
          }
          uVar12 = uVar12 - 1 & uVar12;
        } while (uVar12 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar16] & bStack_49) == 0) break;
      lVar14 = uVar15 + uVar13;
      uVar13 = uVar13 + 1;
      uVar15 = lVar14 + 1U & local_70;
    } while (uVar13 <= local_70);
    if (*(ulong *)(this + 0x108) < *(ulong *)(this + 0x100)) {
      local_98 = (SyntaxNode *)ppSVar10;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_90,ptVar2,(arrays_type *)ptVar2,uVar7,hash,&local_a9,&local_98);
      TVar24.info = (Info *)local_a8;
      TVar24._0_8_ = local_a0;
      *(long *)(this + 0x108) = *(long *)(this + 0x108) + 1;
    }
    else {
      local_98 = (SyntaxNode *)ppSVar10;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_90,ptVar2,hash,&local_a9,&local_98);
      TVar24.info = (Info *)local_a8;
      TVar24._0_8_ = local_a0;
    }
LAB_0047d619:
    local_a8 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                *)TVar24.info;
    local_a0 = TVar24._0_8_;
    iVar4._M_current =
         (((pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
            *)local_80._0_8_)->second).
         super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (((pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
           *)local_80._0_8_)->second).
        super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      this_00 = &((pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                   *)local_80._0_8_)->second;
      local_90._0_8_ = ppSVar10;
      local_90._8_8_ = pFVar8;
      local_80 = TVar24;
      std::
      vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
      ::_M_realloc_insert<slang::syntax::detail::SyntaxChange>
                (this_00,iVar4,(SyntaxChange *)local_90);
    }
    else {
      (iVar4._M_current)->separator = TVar24;
      (iVar4._M_current)->first = (SyntaxNode *)ppSVar10;
      (iVar4._M_current)->second = (SyntaxNode *)pFVar8;
      ppSVar1 = &(((pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                    *)local_80._0_8_)->second).
                 super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
  }
  return;
}

Assistant:

void handle(const FunctionDeclarationSyntax& decl) {
                auto portList = decl.prototype->portList;
                if (!portList)
                    return;

                insertAtFront(portList->ports, makeArg("argA"), makeComma());
                insertAtBack(portList->ports, makeArg("argZ"), makeComma());
            }